

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable_fwd.hpp
# Opt level: O1

bool __thiscall
boost::condition_variable::do_wait_for
          (condition_variable *this,unique_lock<boost::mutex> *lock,timespec *timeout)

{
  bool bVar1;
  int iVar2;
  timespec local_28;
  
  iVar2 = clock_gettime(0,&local_28);
  if (iVar2 == 0) {
    local_28.tv_nsec =
         local_28.tv_nsec + timeout->tv_nsec + (local_28.tv_sec + timeout->tv_sec) * 1000000000;
    local_28.tv_sec = local_28.tv_nsec / 1000000000;
    local_28.tv_nsec = local_28.tv_nsec % 1000000000;
    bVar1 = do_wait_until(this,lock,(timespec *)&local_28);
    return bVar1;
  }
  local_28.tv_sec = 0;
  local_28.tv_nsec = 0;
  __assert_fail("0 && \"Boost::Thread - Internal Error\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/timespec.hpp"
                ,0x68,"timespec boost::detail::timespec_now_realtime()");
}

Assistant:

bool do_wait_for(
            unique_lock<mutex>& lock,
            struct timespec const &timeout)
        {
#if defined BOOST_THREAD_HAS_CONDATTR_SET_CLOCK_MONOTONIC
            return do_wait_until(lock, boost::detail::timespec_plus(timeout, boost::detail::timespec_now_monotonic()));
#else
            // old behavior was fine for monotonic
            return do_wait_until(lock, boost::detail::timespec_plus(timeout, boost::detail::timespec_now_realtime()));
#endif
        }